

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O2

void __thiscall
Assimp::IFC::Schema_2x3::IfcRelDefines::IfcRelDefines(IfcRelDefines *this,void **vtt)

{
  _func_int **pp_Var1;
  void *pvVar2;
  
  IfcRelationship::IfcRelationship((IfcRelationship *)this,vtt + 1);
  pp_Var1 = (_func_int **)vtt[10];
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRelDefines,_1UL>)._vptr_ObjectHelper =
       pp_Var1;
  *(void **)(pp_Var1[-3] +
            (long)&(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRelDefines,_1UL>).
                   _vptr_ObjectHelper) = vtt[0xb];
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRelDefines,_1UL>).aux_is_derived.
  super__Base_bitset<1UL>._M_w = 0;
  pvVar2 = *vtt;
  *(void **)this = pvVar2;
  *(void **)(&this->field_0x0 + *(long *)((long)pvVar2 + -0x18)) = vtt[0xc];
  *(void **)&this->field_0x88 = vtt[0xd];
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRelDefines,_1UL>)._vptr_ObjectHelper =
       (_func_int **)vtt[0xe];
  *(undefined8 *)&(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRelDefines,_1UL>).field_0x10
       = 0;
  *(undefined8 *)&(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRelDefines,_1UL>).field_0x18
       = 0;
  *(undefined8 *)&(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRelDefines,_1UL>).field_0x20
       = 0;
  return;
}

Assistant:

IfcRelDefines() : Object("IfcRelDefines") {}